

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distort.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  _InputArray local_438;
  string fn_dst;
  _InputArray local_400;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pts_ud;
  _InputArray local_3c8;
  _InputArray local_3b0;
  string fn_param;
  string fn_image;
  Mat map_x;
  long local_348;
  long *local_310;
  Mat cam_mtx_ud;
  undefined1 local_2e8 [80];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pts_distort;
  int local_280;
  uint local_27c;
  int local_278;
  uint local_274;
  Mat R;
  Mat map_y;
  long local_200;
  long *local_1c8;
  Mat image_distort;
  undefined4 uStack_1ac;
  Mat image_ud;
  Mat dis_cef;
  Mat cam_mtx;
  
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "2. Distort: input camera params and one undistorted image, then get the distorted image."
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fn_image,"undistort.png",(allocator<char> *)&image_ud);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fn_param,"params.json",(allocator<char> *)&image_ud);
  if (1 < argc) {
    std::__cxx11::string::assign((char *)&fn_image);
    if (argc != 2) {
      std::__cxx11::string::assign((char *)&fn_param);
    }
  }
  cv::imread((string *)&image_ud,(int)&fn_image);
  cVar4 = cv::Mat::empty();
  if (cVar4 != '\0') {
    poVar6 = std::operator<<((ostream *)&std::cout,"cannot load image: ");
    poVar6 = std::operator<<(poVar6,(string *)&fn_image);
    std::endl<char,std::char_traits<char>>(poVar6);
    goto LAB_00102a41;
  }
  cv::Mat::Mat(&cam_mtx);
  cv::Mat::Mat(&dis_cef);
  cv::FileStorage::FileStorage((FileStorage *)&R);
  _cam_mtx_ud = local_2e8;
  local_2e8[0] = 0;
  uVar7 = 0;
  cVar4 = cv::FileStorage::open((string *)&R,(int)&fn_param,(string *)0x0);
  std::__cxx11::string::~string((string *)&cam_mtx_ud);
  uVar12 = 0;
  bVar3 = false;
  if (cVar4 != '\0') {
    cv::FileStorage::operator[]((char *)&cam_mtx_ud);
    cv::operator>>((FileNode *)&cam_mtx_ud,&cam_mtx);
    cv::FileStorage::operator[]((char *)&cam_mtx_ud);
    cv::operator>>((FileNode *)&cam_mtx_ud,&dis_cef);
    cv::FileStorage::operator[]((char *)&map_y);
    _map_x = 0;
    local_348 = 0;
    cv::FileNode::begin();
    _image_distort = &cam_mtx_ud;
    cv::internal::VecReaderProxy<int,_1>::operator()
              ((VecReaderProxy<int,_1> *)&image_distort,(vector<int,_std::allocator<int>_> *)&map_x,
               0x7fffffff);
    uVar12 = 0;
    uVar7 = 0;
    if (_map_x == -8) {
      uVar12 = (ulong)uRamfffffffffffffff8;
      uVar7 = uRamfffffffffffffffc;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&map_x);
    cVar4 = cv::Mat::empty();
    if (cVar4 == '\0') {
      cVar4 = cv::Mat::empty();
      if (cVar4 == '\0') {
        bVar3 = 0 < (int)(uVar7 * (int)uVar12);
        goto LAB_00102666;
      }
    }
    bVar3 = false;
  }
LAB_00102666:
  cv::FileStorage::~FileStorage((FileStorage *)&R);
  if (bVar3) {
    cv::Mat::Mat(&R);
    cv::Mat::clone();
    iVar11 = (int)uVar12;
    local_278 = iVar11;
    local_274 = uVar7;
    cv::Mat::Mat(&map_x,&local_278,5);
    local_280 = iVar11;
    local_27c = uVar7;
    cv::Mat::Mat(&map_y,&local_280,5);
    pts_ud.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pts_ud.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pts_ud.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pts_distort.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pts_distort.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pts_distort.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar5 = 0;
    while (_image_distort = (Mat *)CONCAT44(uStack_1ac,iVar5), iVar5 < (int)uVar7) {
      for (fn_dst._M_dataplus._M_p._0_4_ = 0; (int)fn_dst._M_dataplus._M_p < iVar11;
          fn_dst._M_dataplus._M_p._0_4_ = (int)fn_dst._M_dataplus._M_p + 1) {
        std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<int&,int&>
                  ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&pts_distort,
                   (int *)&fn_dst,(int *)&image_distort);
      }
      iVar5 = _image_distort + 1;
    }
    _image_distort = (Mat *)CONCAT44(uStack_1ac,0x8103000d);
    fn_dst.field_2._M_allocated_capacity = 0;
    fn_dst._M_dataplus._M_p._0_4_ = 0x8203000d;
    fn_dst._M_string_length = (size_type)&pts_ud;
    local_400.sz.width = 0;
    local_400.sz.height = 0;
    local_438.sz.width = 0;
    local_438.sz.height = 0;
    local_400.flags = 0x1010000;
    local_438.flags = 0x1010000;
    local_438.obj = &dis_cef;
    local_3b0.sz.width = 0;
    local_3b0.sz.height = 0;
    local_3c8.sz.width = 0;
    local_3c8.sz.height = 0;
    local_3b0.flags = 0x1010000;
    local_3b0.obj = &R;
    local_3c8.flags = 0x1010000;
    local_3c8.obj = &cam_mtx_ud;
    local_400.obj = &cam_mtx;
    cv::undistortPoints((_InputArray *)&image_distort,(_OutputArray *)&fn_dst,&local_400,&local_438,
                        &local_3b0,&local_3c8);
    uVar8 = 0;
    uVar9 = 0;
    if (0 < iVar11) {
      uVar9 = uVar12;
    }
    uVar12 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar12 = uVar8;
    }
    lVar10 = 4;
    for (; uVar8 != uVar12; uVar8 = uVar8 + 1) {
      lVar1 = *local_1c8;
      lVar2 = *local_310;
      for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
        *(undefined4 *)(lVar2 * uVar8 + local_348 + uVar13 * 4) =
             *(undefined4 *)
              ((long)pts_ud.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar13 * 8 + lVar10 + -4);
        *(undefined4 *)(lVar1 * uVar8 + local_200 + uVar13 * 4) =
             *(undefined4 *)
              ((long)&pts_ud.
                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar13].x + lVar10);
      }
      lVar10 = lVar10 + (long)iVar11 * 8;
    }
    cv::Mat::Mat(&image_distort);
    local_400.sz.width = 0;
    local_400.sz.height = 0;
    local_400.flags = 0x1010000;
    local_438.sz.width = 0;
    local_438.sz.height = 0;
    local_438.flags = 0x2010000;
    local_3b0.sz.width = 0;
    local_3b0.sz.height = 0;
    local_3c8.sz.width = 0;
    local_3c8.sz.height = 0;
    local_3b0.flags = 0x1010000;
    local_3b0.obj = &map_x;
    local_3c8.flags = 0x1010000;
    local_3c8.obj = &map_y;
    local_438.obj = (_InputArray *)&image_distort;
    local_400.obj = &image_ud;
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)&fn_dst);
    cv::remap(&local_400,(_OutputArray *)&local_438,&local_3b0,&local_3c8,1,0,(Scalar_ *)&fn_dst);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fn_dst,"distort.png",(allocator<char> *)&local_400);
    local_400.sz.width = 0;
    local_400.sz.height = 0;
    local_400.flags = 0x1010000;
    local_438.flags = 0;
    local_438._4_4_ = 0;
    local_438.obj = (void *)0x0;
    local_438.sz.width = 0;
    local_438.sz.height = 0;
    local_400.obj = (_InputArray *)&image_distort;
    cv::imwrite((string *)&fn_dst,&local_400,(vector *)&local_438);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_438);
    poVar6 = std::operator<<((ostream *)&std::cout,"image saved to ");
    poVar6 = std::operator<<(poVar6,(string *)&fn_dst);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::string::~string((string *)&fn_dst);
    cv::Mat::~Mat(&image_distort);
    std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
              (&pts_distort.
                super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
    std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
              (&pts_ud.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
    cv::Mat::~Mat(&map_y);
    cv::Mat::~Mat(&map_x);
    cv::Mat::~Mat(&cam_mtx_ud);
    cv::Mat::~Mat(&R);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"cannot load camera params from ");
    poVar6 = std::operator<<(poVar6,(string *)&fn_param);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  cv::Mat::~Mat(&dis_cef);
  cv::Mat::~Mat(&cam_mtx);
LAB_00102a41:
  cv::Mat::~Mat(&image_ud);
  std::__cxx11::string::~string((string *)&fn_param);
  std::__cxx11::string::~string((string *)&fn_image);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    cout << "2. Distort: input camera params and one undistorted image, then get the distorted image." << endl;

    string fn_image = "undistort.png";
    string fn_param = "params.json";
    if (argc > 1)
        fn_image = argv[1];
    if (argc > 2)
        fn_param = argv[2];
    Mat image_ud = imread(fn_image, IMREAD_GRAYSCALE);
    if (image_ud.empty()) {
        cout << "cannot load image: " << fn_image << endl;
        return 0;
    }
    Mat cam_mtx, dis_cef;
    Size image_size;
    auto loadParams = [&]() {
        FileStorage fs;
        if (!fs.open(fn_param, FileStorage::READ))
            return false;
        fs["cam_mtx"] >> cam_mtx;
        fs["dis_cef"] >> dis_cef;
        fs["image_size"] >> image_size;
        return !cam_mtx.empty() && !dis_cef.empty() && image_size.area() > 0;
    };
    if (!loadParams()) {
        cout << "cannot load camera params from " << fn_param << endl;
        return 0;
    }

    Mat R;
    Mat cam_mtx_ud = cam_mtx.clone();

    // add distortion
    Mat map_x = Mat(image_size, CV_32FC1);
    Mat map_y = Mat(image_size, CV_32FC1);
    vector<Point2f> pts_ud, pts_distort;
    for (int y = 0; y < image_size.height; ++y)
        for (int x = 0; x < image_size.width; ++x)
            pts_distort.emplace_back(x, y);
    undistortPoints(pts_distort, pts_ud, cam_mtx, dis_cef, R, cam_mtx_ud);
    for (int y = 0; y < image_size.height; ++y) {
        float* ptr1 = map_x.ptr<float>(y);
        float* ptr2 = map_y.ptr<float>(y);
        for (int x = 0; x < image_size.width; ++x) {
            const auto& pt = pts_ud[y * image_size.width + x];
            ptr1[x] = pt.x;
            ptr2[x] = pt.y;
        }
    }
    Mat image_distort;
    remap(image_ud, image_distort, map_x, map_y, INTER_LINEAR);

    string fn_dst = "distort.png";
    imwrite(fn_dst, image_distort);
    cout << "image saved to " << fn_dst << endl;

    return 0;
}